

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.h
# Opt level: O3

node_type * __thiscall
Tree<NULLC::Range>::erase(Tree<NULLC::Range> *this,node_type *node,Range *key)

{
  node_type *y;
  node<NULLC::Range> *pnVar1;
  node<NULLC::Range> *pnVar2;
  void *pvVar3;
  SmallBlock<detail::node<NULLC::Range>_> *pSVar4;
  MySmallBlock *pMVar5;
  MySmallBlock *freedBlock;
  node_type *pnVar6;
  MySmallBlock *pMVar7;
  node_type *pnVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  MySmallBlock *node_00;
  
  if (node == (node_type *)0x0) {
LAB_00123006:
    pnVar8 = (node_type *)0x0;
  }
  else {
    pnVar8 = node;
    if (key->end < (node->key).start) {
      pnVar6 = erase(this,node->left,key);
      node->left = pnVar6;
    }
    else if ((node->key).end < key->start) {
      node_00 = (MySmallBlock *)node->right;
LAB_00122f0d:
      pnVar6 = erase(this,(node_type *)node_00,key);
      node->right = pnVar6;
    }
    else {
      node_00 = (MySmallBlock *)node->right;
      if ((MySmallBlock *)node->left == (MySmallBlock *)0x0) {
        pMVar7 = node_00;
        if (node_00 != (MySmallBlock *)0x0) goto LAB_00122f23;
        pnVar8 = (node_type *)0x0;
        pMVar7 = (MySmallBlock *)node;
      }
      else {
        pMVar5 = node_00;
        pMVar7 = (MySmallBlock *)node->left;
        if (node_00 != (MySmallBlock *)0x0) {
          do {
            key = (Range *)pMVar5;
            pMVar5 = (MySmallBlock *)((Range *)((long)key + 0x10))->start;
          } while ((MySmallBlock *)((Range *)((long)key + 0x10))->start != (MySmallBlock *)0x0);
          pvVar3 = *(void **)((long)key + 8);
          (node->key).start = *(SmallBlock<detail::node<NULLC::Range>_> **)key;
          (node->key).end = pvVar3;
          goto LAB_00122f0d;
        }
LAB_00122f23:
        node->height = *(int *)&((Range *)(pMVar7->data + 0x20))->start;
        pSVar4 = pMVar7->next;
        pvVar3 = *(void **)((long)pMVar7 + 8);
        pnVar1 = *(node<NULLC::Range> **)(pMVar7->data + 0x18);
        node->left = (node<NULLC::Range> *)((Range *)(pMVar7->data + 0x10))->start;
        node->right = pnVar1;
        (node->key).start = pSVar4;
        (node->key).end = pvVar3;
      }
      pMVar7->next = (this->pool).freeBlocks;
      (this->pool).freeBlocks = pMVar7;
      if (pMVar7 == (MySmallBlock *)this->root) {
        this->root = pnVar8;
      }
      if (pnVar8 == (node_type *)0x0) goto LAB_00123006;
    }
    pnVar6 = pnVar8->left;
    iVar11 = 0;
    iVar9 = 0;
    if (pnVar6 != (node_type *)0x0) {
      iVar9 = pnVar6->height;
    }
    y = pnVar8->right;
    if (y != (node_type *)0x0) {
      iVar11 = y->height;
    }
    if (iVar11 < iVar9) {
      iVar11 = iVar9;
    }
    iVar10 = 0;
    pnVar8->height = iVar11 + 1;
    iVar9 = 0;
    if (pnVar6 != (node_type *)0x0) {
      iVar9 = pnVar6->height;
    }
    if (y != (node_type *)0x0) {
      iVar10 = y->height;
    }
    if (1 < iVar9 - iVar10) {
      if (pnVar6 != (node_type *)0x0) {
        pnVar1 = pnVar6->left;
        iVar11 = 0;
        iVar9 = 0;
        if (pnVar1 != (node<NULLC::Range> *)0x0) {
          iVar9 = pnVar1->height;
        }
        pnVar2 = pnVar6->right;
        if (pnVar2 != (node<NULLC::Range> *)0x0) {
          iVar11 = pnVar2->height;
        }
        if (iVar9 < iVar11) {
          iVar11 = 0;
          iVar9 = 0;
          if (pnVar1 != (node<NULLC::Range> *)0x0) {
            iVar9 = pnVar1->height;
          }
          if (pnVar2 != (node<NULLC::Range> *)0x0) {
            iVar11 = pnVar2->height;
          }
          if (iVar11 <= iVar9) {
            return pnVar8;
          }
          pnVar6 = left_rotate(this,pnVar6);
          pnVar8->left = pnVar6;
        }
      }
      pnVar8 = right_rotate(this,pnVar8);
      return pnVar8;
    }
    if (iVar9 - iVar10 < -1) {
      if (y != (node_type *)0x0) {
        pnVar1 = y->left;
        iVar11 = 0;
        iVar9 = 0;
        if (pnVar1 != (node<NULLC::Range> *)0x0) {
          iVar9 = pnVar1->height;
        }
        pnVar2 = y->right;
        if (pnVar2 != (node<NULLC::Range> *)0x0) {
          iVar11 = pnVar2->height;
        }
        if (iVar11 < iVar9) {
          iVar11 = 0;
          iVar9 = 0;
          if (pnVar1 != (node<NULLC::Range> *)0x0) {
            iVar9 = pnVar1->height;
          }
          if (pnVar2 != (node<NULLC::Range> *)0x0) {
            iVar11 = pnVar2->height;
          }
          if (iVar9 <= iVar11) {
            return pnVar8;
          }
          pnVar6 = right_rotate(this,y);
          pnVar8->right = pnVar6;
        }
      }
      pnVar8 = left_rotate(this,pnVar8);
      return pnVar8;
    }
  }
  return pnVar8;
}

Assistant:

node_type* erase(node_type* node, const T& key)
	{
		if(node == NULL)
			return node;

		if(key < node->key)
		{
			node->left = erase(node->left, key);
		}else if(key > node->key){
			node->right = erase(node->right, key);
		}else{
			if((node->left == NULL) || (node->right == NULL))
			{
				node_type *temp = node->left ? node->left : node->right;

				if(temp == NULL)
				{
					temp = node;
					node = NULL;
				}else{
					*node = *temp;
				}

				pool.Deallocate(temp);

				if(temp == root)
					root = node;
			}else{
				node_type* temp = node->right->min_tree();

				node->key = temp->key;

				node->right = erase(node->right, temp->key);
			}
		}

		if(node == NULL)
			return node;

		node->height = detail::max(get_height(node->left), get_height(node->right)) + 1;

		int balance = get_balance(node);

		if(balance > 1 && get_balance(node->left) >= 0)
			return right_rotate(node);

		if(balance > 1 && get_balance(node->left) < 0)
		{
			node->left =  left_rotate(node->left);
			return right_rotate(node);
		}

		if(balance < -1 && get_balance(node->right) <= 0)
			return left_rotate(node);

		if(balance < -1 && get_balance(node->right) > 0)
		{
			node->right = right_rotate(node->right);
			return left_rotate(node);
		}

		return node;
	}